

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_inter_pred_chroma_copy_ssse3
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  int offset_2;
  int offset_1;
  int offset;
  __m128i mask_4x32b;
  __m128i s3;
  WORD32 col;
  WORD32 row;
  int local_194;
  int local_190;
  int local_18c;
  int local_164;
  int local_160;
  long local_148;
  long local_140;
  
  if (offset_1 % 2 != 0) {
    __assert_fail("(wd % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0xda2,
                  "void ihevc_inter_pred_chroma_copy_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if (in_R9D % 2 != 0) {
    __assert_fail("(ht % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0xda3,
                  "void ihevc_inter_pred_chroma_copy_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  local_148 = in_RSI;
  local_140 = in_RDI;
  if (offset_1 % 8 == 0) {
    for (local_160 = 0; local_160 < in_R9D; local_160 = local_160 + 2) {
      local_18c = 0;
      for (local_164 = 0; SBORROW4(local_164,offset_1 * 2) != local_164 + offset_1 * -2 < 0;
          local_164 = local_164 + 0x10) {
        uVar1 = ((undefined8 *)(local_140 + local_18c))[1];
        *(undefined8 *)(local_148 + local_18c) = *(undefined8 *)(local_140 + local_18c);
        ((undefined8 *)(local_148 + local_18c))[1] = uVar1;
        puVar2 = (undefined8 *)(local_140 + in_EDX + (long)local_18c);
        uVar1 = puVar2[1];
        puVar3 = (undefined8 *)(local_148 + in_ECX + (long)local_18c);
        *puVar3 = *puVar2;
        puVar3[1] = uVar1;
        local_18c = local_18c + 0x10;
      }
      local_140 = local_140 + (in_EDX << 1);
      local_148 = local_148 + (in_ECX << 1);
    }
  }
  else if (offset_1 % 4 == 0) {
    for (local_160 = 0; local_160 < in_R9D; local_160 = local_160 + 2) {
      local_190 = 0;
      for (local_164 = 0; SBORROW4(local_164,offset_1 * 2) != local_164 + offset_1 * -2 < 0;
          local_164 = local_164 + 8) {
        *(undefined8 *)(local_148 + local_190) = *(undefined8 *)(local_140 + local_190);
        *(undefined8 *)(local_148 + in_ECX + (long)local_190) =
             *(undefined8 *)(local_140 + in_EDX + (long)local_190);
        local_190 = local_190 + 8;
      }
      local_140 = local_140 + (in_EDX << 1);
      local_148 = local_148 + (in_ECX << 1);
    }
  }
  else {
    for (local_160 = 0; local_160 < in_R9D; local_160 = local_160 + 2) {
      local_194 = 0;
      for (local_164 = 0; SBORROW4(local_164,offset_1 * 2) != local_164 + offset_1 * -2 < 0;
          local_164 = local_164 + 4) {
        maskmovdqu(*(undefined1 (*) [16])(local_140 + local_194),ZEXT816(0x80808080));
        maskmovdqu(*(undefined1 (*) [16])(local_140 + in_EDX + (long)local_194),ZEXT816(0x80808080))
        ;
        local_194 = local_194 + 4;
      }
      local_140 = local_140 + (in_EDX << 1);
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_copy_ssse3(UWORD8 *pu1_src,
                                        UWORD8 *pu1_dst,
                                        WORD32 src_strd,
                                        WORD32 dst_strd,
                                        WORD8 *pi1_coeff,
                                        WORD32 ht,
                                        WORD32 wd)
{
    WORD32 row, col;
    __m128i  s3, mask_4x32b;
    UNUSED(pi1_coeff);
    ASSERT(wd % 2 == 0); /* checking assumption*/
    ASSERT(ht % 2 == 0); /* checking assumption*/

    mask_4x32b = _mm_set_epi32(0, 0, 0, 0x80808080); /* Mask register */

/*  for loop starts from here */
    if(wd % 8 == 0)
    {
        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;
            for(col = 0; col < 2 * wd; col += 16)
            {
/* row =0 */

                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + offset)); /* pu1_src[col]; */
                /* storing 16 8-bit output values */
                _mm_storeu_si128((__m128i *)(pu1_dst + offset), s3); /* pu1_dst[col] = pu1_src[col]; */

/* row =1 */
                /*load 16 pixel values from 271:256 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + src_strd + offset)); /* pu1_src[col]; */
                /* storing 8 8-bit output values */
                _mm_storeu_si128((__m128i *)(pu1_dst + dst_strd + offset), s3); /* pu1_dst[col] = pu1_src[col]*/

                offset += 16; /*To pointer update */
            } /*  inner for loop ends here(16-output values in single iteration) */

            pu1_src += 2 * src_strd; /* pointer update */
            pu1_dst += 2 * dst_strd; /* pointer update */
        }
    }
    else if(wd % 4 == 0)
    {
        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;
            for(col = 0; col < 2 * wd; col += 8)
            {
/* row =0  */
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + offset)); /* pu1_src[col]; */
                /* storing 8 8-bit output values */
                _mm_storel_epi64((__m128i *)(pu1_dst + offset), s3); /* pu1_dst[col] = pu1_src[col]; */
/* row =1 */
                /*load 16 pixel values from 271:256 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + src_strd + offset)); /* pu1_src[col]; */
                /* storing 8 8-bit output values */
                _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), s3); /* pu1_dst[col] = pu1_src[col]; */

                offset += 8; /* To pointer update */
            } /* inner for loop ends here(8-output values in single iteration) */

            pu1_src += 2 * src_strd;  /* pointer update */
            pu1_dst += 2 * dst_strd;  /* pointer update */
        }
    }
    else
    {
        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;
            for(col = 0; col < 2 * wd; col += 4)
            {
/* row =0 */
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + offset)); /* pu1_src[col] */
                /* storing four 8-bit output values */
                _mm_maskmoveu_si128(s3, mask_4x32b, (char *)(pu1_dst + offset)); /* pu1_dst[col] = pu1_src[col]; */
/* row =1 */
                /* pu1_src[col] */
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + src_strd + offset));

                /* storing four 8-bit output values */
                _mm_maskmoveu_si128(s3, mask_4x32b, (char *)(pu1_dst + dst_strd + offset)); /* pu1_dst[col] = pu1_src[col]; */

                offset += 4; /* To pointer update */
            } /*  inner for loop ends here(4-output values in single iteration) */

            pu1_src += 2 * src_strd; /* pointer increment */
            pu1_dst += 2 * dst_strd; /* pointer increment */
        }
    }
}